

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall
QByteArray::repeated(QByteArray *__return_storage_ptr__,QByteArray *this,qsizetype times)

{
  long lVar1;
  Data *pDVar2;
  ulong uVar3;
  char *pcVar4;
  size_t __n;
  longlong __old_val;
  ulong asize;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->d).size;
  if (lVar1 != 0) {
    if (1 < times) {
      asize = lVar1 * times;
      local_48.d = (Data *)0x0;
      local_48.ptr = (char *)0x0;
      local_48.size = 0;
      reserve((QByteArray *)&local_48,asize);
      if (local_48.d == (Data *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = ((local_48.d)->super_QArrayData).alloc;
      }
      if (uVar3 == asize) {
        pcVar4 = (this->d).ptr;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = &_empty;
        }
        memcpy(local_48.ptr,pcVar4,(this->d).size);
        __n = (this->d).size;
        pcVar4 = local_48.ptr + __n;
        for (; (long)__n <= (long)(asize >> 1); __n = __n * 2) {
          memcpy(pcVar4,local_48.ptr,__n);
          pcVar4 = pcVar4 + __n;
        }
        memcpy(pcVar4,local_48.ptr,asize - __n);
        pcVar4 = local_48.ptr;
        pDVar2 = local_48.d;
        local_48.ptr[asize] = '\0';
        local_48.d = (Data *)0x0;
        local_48.ptr = (char *)0x0;
        (__return_storage_ptr__->d).d = pDVar2;
        (__return_storage_ptr__->d).ptr = pcVar4;
        local_48.size = 0;
        (__return_storage_ptr__->d).size = asize;
      }
      else {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return __return_storage_ptr__;
      }
      goto LAB_002d2690;
    }
    if (times != 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_002d2690;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&this->d);
    return __return_storage_ptr__;
  }
LAB_002d2690:
  __stack_chk_fail();
}

Assistant:

QByteArray QByteArray::repeated(qsizetype times) const
{
    if (isEmpty())
        return *this;

    if (times <= 1) {
        if (times == 1)
            return *this;
        return QByteArray();
    }

    const qsizetype resultSize = times * size();

    QByteArray result;
    result.reserve(resultSize);
    if (result.capacity() != resultSize)
        return QByteArray(); // not enough memory

    memcpy(result.d.data(), data(), size());

    qsizetype sizeSoFar = size();
    char *end = result.d.data() + sizeSoFar;

    const qsizetype halfResultSize = resultSize >> 1;
    while (sizeSoFar <= halfResultSize) {
        memcpy(end, result.d.data(), sizeSoFar);
        end += sizeSoFar;
        sizeSoFar <<= 1;
    }
    memcpy(end, result.d.data(), resultSize - sizeSoFar);
    result.d.data()[resultSize] = '\0';
    result.d.size = resultSize;
    return result;
}